

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_banish(command_conflict *cmd)

{
  wchar_t wVar1;
  wchar_t wVar2;
  monster_conflict *pmVar3;
  monster *mon;
  wchar_t i;
  wchar_t d;
  command_conflict *cmd_local;
  
  _i = cmd;
  wVar1 = cmd_get_arg_number((command *)cmd,"range",(int *)((long)&mon + 4));
  if (wVar1 != L'\0') {
    mon._4_4_ = get_quantity("Zap within what distance? ",(uint)z_info->max_sight);
    cmd_set_arg_number((command *)_i,"range",mon._4_4_);
  }
  for (mon._0_4_ = L'\x01'; wVar1 = (wchar_t)mon, wVar2 = cave_monster_max(cave), wVar1 < wVar2;
      mon._0_4_ = (wchar_t)mon + L'\x01') {
    pmVar3 = cave_monster(cave,(wchar_t)mon);
    if ((pmVar3->race != (monster_race *)0x0) && ((int)(uint)pmVar3->cdis <= mon._4_4_)) {
      delete_monster_idx((wchar_t)mon);
    }
  }
  player->upkeep->redraw = player->upkeep->redraw | 0x400000;
  return;
}

Assistant:

void do_cmd_wiz_banish(struct command *cmd)
{
	int d, i;

	if (cmd_get_arg_number(cmd, "range", &d) != CMD_OK) {
		d = get_quantity("Zap within what distance? ",
			z_info->max_sight);
		cmd_set_arg_number(cmd, "range", d);
	}

	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);

		/* Skip dead monsters */
		if (!mon->race) continue;

		/* Skip distant monsters */
		if (mon->cdis > d) continue;

		/* Delete the monster */
		delete_monster_idx(i);
	}

	/* Update monster list window */
	player->upkeep->redraw |= PR_MONLIST;
}